

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O3

void __thiscall
QDoubleSpinBoxPrivate::emitSignals(QDoubleSpinBoxPrivate *this,EmitPolicy ep,QVariant *old)

{
  undefined1 *puVar1;
  QObject *pQVar2;
  char cVar3;
  long in_FS_OFFSET;
  QString local_58;
  void *local_38;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (ep != NeverEmit) {
    pQVar2 = *(QObject **)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
    puVar1 = &(this->super_QAbstractSpinBoxPrivate).field_0x3d0;
    *puVar1 = *puVar1 & 0xfe;
    if (ep != AlwaysEmit) {
      cVar3 = ::QVariant::equals(&(this->super_QAbstractSpinBoxPrivate).value);
      if (cVar3 != '\0') goto LAB_0047ffce;
    }
    QLineEdit::displayText(&local_58,(this->super_QAbstractSpinBoxPrivate).edit);
    local_38 = (void *)0x0;
    local_30 = (undefined1 *)&local_58;
    QMetaObject::activate(pQVar2,&QDoubleSpinBox::staticMetaObject,1,&local_38);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_38 = (void *)::QVariant::toDouble((bool *)&(this->super_QAbstractSpinBoxPrivate).value);
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)&local_38;
    QMetaObject::activate(pQVar2,&QDoubleSpinBox::staticMetaObject,0,(void **)&local_58);
  }
LAB_0047ffce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDoubleSpinBoxPrivate::emitSignals(EmitPolicy ep, const QVariant &old)
{
    Q_Q(QDoubleSpinBox);
    if (ep != NeverEmit) {
        pendingEmit = false;
        if (ep == AlwaysEmit || value != old) {
            emit q->textChanged(edit->displayText());
            emit q->valueChanged(value.toDouble());
        }
    }
}